

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  uint uVar1;
  int *piVar2;
  BtShared *pBt;
  bool bVar3;
  MemPage *pMVar4;
  Pgno pgno;
  int iVar5;
  uint uVar6;
  uint uVar7;
  DbPage *pPg;
  MemPage *pPage;
  MemPage *local_48;
  Pgno local_3c;
  MemPage *local_38;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  local_48 = (MemPage *)0x0;
  pBt = p->pBt;
  if (pBt->nPage < (uint)iTable) {
    iVar5 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11b05,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    goto LAB_0014bde9;
  }
  iVar5 = btreeGetPage(pBt,iTable,&local_48,0);
  if (iVar5 != 0) goto LAB_0014bde9;
  iVar5 = sqlite3BtreeClearTable(p,iTable,(int *)0x0);
  pMVar4 = local_48;
  if (iVar5 == 0) {
    *piMoved = 0;
    if (pBt->autoVacuum != '\0') {
      sqlite3BtreeGetMeta(p,4,&local_3c);
      pgno = local_3c;
      pMVar4 = local_48;
      if (local_3c == iTable) {
        iVar5 = freePage2(local_48->pBt,local_48,local_48->pgno);
        if (pMVar4 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
        }
        if (iVar5 != 0) goto LAB_0014bde9;
      }
      else {
        if (local_48 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_48->pDbPage);
        }
        iVar5 = btreeGetPage(pBt,pgno,&local_38,0);
        pMVar4 = local_38;
        if (iVar5 == 0) {
          iVar5 = relocatePage(pBt,local_38,'\x01',0,iTable,0);
          if (pMVar4 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
          }
          if (iVar5 != 0) goto LAB_0014bf43;
          local_38 = (MemPage *)0x0;
          iVar5 = btreeGetPage(pBt,pgno,&local_38,0);
          pMVar4 = local_38;
          if (iVar5 == 0) {
            iVar5 = freePage2(local_38->pBt,local_38,local_38->pgno);
          }
          if (pMVar4 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
          }
          if (iVar5 != 0) goto LAB_0014bf43;
          *piMoved = pgno;
          bVar3 = true;
        }
        else {
LAB_0014bf43:
          bVar3 = false;
        }
        if (!bVar3) goto LAB_0014bde9;
      }
      uVar6 = (uint)sqlite3PendingByte / pBt->pageSize;
      do {
        do {
          uVar1 = pgno;
          local_3c = uVar1 - 1;
          pgno = local_3c;
        } while ((-2 - uVar6) + local_3c == -1);
        uVar7 = 0;
        if (1 < local_3c) {
          uVar1 = uVar1 - 3;
          iVar5 = uVar1 - uVar1 % (pBt->usableSize / 5 + 1);
          uVar7 = iVar5 + (uint)(iVar5 + 1U == uVar6) + 2;
        }
      } while (local_3c == uVar7);
      iVar5 = sqlite3BtreeUpdateMeta(p,4,local_3c);
      goto LAB_0014bde9;
    }
    iVar5 = freePage2(local_48->pBt,local_48,local_48->pgno);
    if (pMVar4 == (MemPage *)0x0) goto LAB_0014bde9;
    pPg = pMVar4->pDbPage;
  }
  else {
    if (local_48 == (MemPage *)0x0) goto LAB_0014bde9;
    pPg = local_48->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_0014bde9:
  if (p->sharable != '\0') {
    piVar2 = &p->wantToLock;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}